

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O3

void ga_sort_gath(Integer *pn,Integer *i,Integer *j,Integer *base)

{
  long lVar1;
  undefined8 uVar2;
  Integer IVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  Integer *pIVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  long *plVar13;
  
  uVar10 = *pn;
  if (1 < (long)uVar10) {
    uVar6 = uVar10 >> 1;
    uVar10 = (ulong)((uint)uVar10 & 1);
    lVar4 = uVar6 * 0x10 + uVar10 * 8 + -8;
    if (uVar6 != 1) {
      plVar7 = base + uVar10 + uVar6 * 2 + -1;
      do {
        plVar13 = base + (uVar6 - 1) + uVar6;
        plVar11 = base + (uVar6 - 1);
        uVar10 = uVar6;
        while (plVar13 <= plVar7) {
          uVar10 = uVar10 * 2;
          if (plVar13 == plVar7) {
            lVar8 = *plVar7;
            plVar5 = plVar7;
          }
          else {
            lVar1 = *plVar13;
            lVar12 = plVar13[1];
            lVar8 = lVar1;
            if (lVar1 < lVar12) {
              lVar8 = lVar12;
            }
            plVar5 = plVar13 + 1;
            if (lVar12 <= lVar1) {
              plVar5 = plVar13;
            }
            uVar10 = uVar10 | lVar1 < lVar12;
          }
          lVar1 = *plVar11;
          if (lVar8 <= lVar1) break;
          lVar12 = (long)plVar5 - (long)base;
          *plVar11 = lVar8;
          lVar8 = (long)plVar11 - (long)base;
          *plVar5 = lVar1;
          uVar2 = *(undefined8 *)((long)i + lVar8);
          *(undefined8 *)((long)i + lVar8) = *(undefined8 *)((long)i + lVar12);
          *(undefined8 *)((long)i + lVar12) = uVar2;
          uVar2 = *(undefined8 *)((long)j + lVar8);
          *(undefined8 *)((long)j + lVar8) = *(undefined8 *)((long)j + lVar12);
          *(undefined8 *)((long)j + lVar12) = uVar2;
          plVar11 = plVar5;
          plVar13 = plVar5 + uVar10;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 1);
    }
    if (lVar4 != 0) {
      do {
        if (7 < lVar4) {
          plVar7 = (long *)((long)base + lVar4);
          uVar10 = 1;
          pIVar9 = base;
          plVar13 = base + 1;
          do {
            uVar10 = uVar10 * 2;
            if (plVar13 == plVar7) {
              lVar8 = *plVar7;
              plVar11 = plVar7;
            }
            else {
              lVar1 = *plVar13;
              lVar12 = plVar13[1];
              lVar8 = lVar1;
              if (lVar1 < lVar12) {
                lVar8 = lVar12;
              }
              plVar11 = plVar13 + 1;
              if (lVar12 <= lVar1) {
                plVar11 = plVar13;
              }
              uVar10 = uVar10 | lVar1 < lVar12;
            }
            lVar1 = *pIVar9;
            if (lVar8 <= lVar1) break;
            lVar12 = (long)plVar11 - (long)base;
            *pIVar9 = lVar8;
            lVar8 = (long)pIVar9 - (long)base;
            *plVar11 = lVar1;
            uVar2 = *(undefined8 *)((long)i + lVar8);
            *(undefined8 *)((long)i + lVar8) = *(undefined8 *)((long)i + lVar12);
            *(undefined8 *)((long)i + lVar12) = uVar2;
            uVar2 = *(undefined8 *)((long)j + lVar8);
            *(undefined8 *)((long)j + lVar8) = *(undefined8 *)((long)j + lVar12);
            *(undefined8 *)((long)j + lVar12) = uVar2;
            plVar13 = plVar11 + uVar10;
            pIVar9 = plVar11;
          } while (plVar13 <= plVar7);
        }
        IVar3 = *base;
        *base = *(Integer *)((long)base + lVar4);
        *(Integer *)((long)base + lVar4) = IVar3;
        IVar3 = *i;
        *i = *(Integer *)((long)i + lVar4);
        *(Integer *)((long)i + lVar4) = IVar3;
        IVar3 = *j;
        *j = *(Integer *)((long)j + lVar4);
        *(Integer *)((long)j + lVar4) = IVar3;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void ga_sort_gath(pn, i, j, base)
     Integer *pn;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;
  
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}